

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall
CVmObjIterLookupTable::CVmObjIterLookupTable(CVmObjIterLookupTable *this,vm_val_t *coll)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->super_CVmObjIter).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_0031de50;
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,9,this);
  (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)CONCAT44(extraout_var,iVar2);
  vmb_put_dh((char *)CONCAT44(extraout_var,iVar2),coll);
  pcVar1 = (this->super_CVmObjIter).super_CVmObject.ext_;
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1 = (this->super_CVmObjIter).super_CVmObject.ext_;
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  return;
}

Assistant:

CVmObjIterLookupTable::CVmObjIterLookupTable(VMG_ const vm_val_t *coll)
{
    /* allocate space for our extension data */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(VMOBJITERLOOKUPTABLE_EXT_SIZE, this);

    /* save the collection value */
    vmb_put_dh(ext_, coll);

    /* clear the flags */
    set_flags(0);

    /* 
     *   set up at index zero - we're not at a valid entry until initialized
     *   with getNext 
     */
    set_entry_index(0);
}